

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void artrans(int p,double *old,double *new1)

{
  void *__ptr;
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  __ptr = malloc((long)p * 8);
  uVar6 = 0;
  uVar5 = 0;
  if (0 < p) {
    uVar5 = (ulong)(uint)p;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    dVar7 = tanh(old[uVar6]);
    new1[uVar6] = dVar7;
    *(double *)((long)__ptr + uVar6 * 8) = dVar7;
  }
  pdVar2 = new1;
  for (lVar1 = 1; lVar1 < p; lVar1 = lVar1 + 1) {
    dVar7 = new1[lVar1];
    pdVar3 = pdVar2;
    for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
      *(double *)((long)__ptr + lVar4 * 8) = *pdVar3 * -dVar7 + *(double *)((long)__ptr + lVar4 * 8)
      ;
      pdVar3 = pdVar3 + -1;
    }
    for (lVar4 = 0; lVar1 != lVar4; lVar4 = lVar4 + 1) {
      new1[lVar4] = *(double *)((long)__ptr + lVar4 * 8);
    }
    pdVar2 = pdVar2 + 1;
  }
  free(__ptr);
  return;
}

Assistant:

void artrans(int p, double *old, double *new1) {
	int j, k;
	double a;
	double *temp;

	temp = (double*)malloc(sizeof(double)* p);

	for (j = 0; j < p; ++j) {
		new1[j] = tanh(old[j]);
		temp[j] = new1[j];
	}

	for (j = 1; j < p; ++j) {
		a = new1[j];
		for (k = 0; k < j; ++k) {
			temp[k] -= a * new1[j - k - 1];
		}
		for (k = 0; k < j; ++k) {
			new1[k] = temp[k];
		}
	}

	free(temp);
}